

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzpostprocanalysis.cpp
# Opt level: O0

TPZCompEl * TPZPostProcAnalysis::CreateQuadEl(TPZGeoEl *gel,TPZCompMesh *mesh)

{
  int iVar1;
  TPZCompEl *pTVar2;
  TPZCompMesh *in_RSI;
  TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_> *in_RDI;
  TPZGeoEl *in_stack_ffffffffffffffe0;
  
  pTVar2 = TPZGeoEl::Reference((TPZGeoEl *)in_RDI);
  if ((pTVar2 == (TPZCompEl *)0x0) &&
     (iVar1 = TPZGeoEl::NumInterfaces((TPZGeoEl *)in_RDI), iVar1 == 0)) {
    pTVar2 = (TPZCompEl *)operator_new(200);
    TPZCompElPostProc<TPZCompElH1<pzshape::TPZShapeQuad>_>::TPZCompElPostProc
              (in_RDI,in_RSI,in_stack_ffffffffffffffe0);
    return pTVar2;
  }
  return (TPZCompEl *)0x0;
}

Assistant:

TPZCompEl *TPZPostProcAnalysis::CreateQuadEl(TPZGeoEl *gel,TPZCompMesh &mesh) {
	if(!gel->Reference() && gel->NumInterfaces() == 0)
		return new TPZCompElPostProc<TPZCompElH1<TPZShapeQuad> >(mesh,gel);
	return NULL;
}